

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int __thiscall QString::remove(QString *this,char *__filename)

{
  char16_t *pcVar1;
  Data *pDVar2;
  QArrayData *data;
  qsizetype qVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  CaseSensitivity in_ECX;
  long lVar6;
  char *in_RDX;
  size_t __n;
  char16_t *pcVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  ulong uVar10;
  char16_t *pcVar11;
  char16_t *pcVar12;
  long in_FS_OFFSET;
  QStringView haystack;
  QStringView haystack_00;
  QStringView haystack_01;
  QLatin1StringView needle;
  QLatin1StringView needle_00;
  QLatin1StringView needle_01;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (__filename != (char *)0x0) {
    pcVar1 = (this->d).ptr;
    qVar5 = (this->d).size;
    pcVar7 = pcVar1;
    if (pcVar1 == (char16_t *)0x0) {
      pcVar7 = &_empty;
    }
    haystack.m_data = pcVar7;
    haystack.m_size = qVar5;
    needle.m_data = in_RDX;
    needle.m_size = (qsizetype)__filename;
    qVar3 = QtPrivate::findString(haystack,0,needle,in_ECX);
    if (-1 < qVar3) {
      pcVar7 = pcVar1 + qVar5;
      pDVar2 = (this->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString(&local_58,qVar5,Uninitialized);
        if ((local_58.d.d == (Data *)0x0) ||
           (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          reallocData(&local_58,local_58.d.size,KeepSize);
        }
        pcVar11 = local_58.d.ptr;
        pcVar9 = local_58.d.ptr;
        if (qVar3 != 0) {
          uVar10 = qVar3 + 1;
          pcVar8 = pcVar1;
          do {
            *pcVar9 = *pcVar8;
            pcVar8 = pcVar8 + 1;
            pcVar9 = pcVar9 + 1;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
        pcVar8 = pcVar1 + (long)(__filename + qVar3);
        if (pcVar8 < pcVar7) {
          pcVar12 = (this->d).ptr;
          if (pcVar12 == (char16_t *)0x0) {
            pcVar12 = &_empty;
          }
          qVar5 = (this->d).size;
          do {
            haystack_00.m_data = pcVar12;
            haystack_00.m_size = qVar5;
            needle_00.m_data = in_RDX;
            needle_00.m_size = (qsizetype)__filename;
            qVar3 = QtPrivate::findString
                              (haystack_00,(long)pcVar8 - (long)pcVar1 >> 1,needle_00,in_ECX);
            pcVar4 = pcVar1 + qVar3;
            if (qVar3 == -1) {
              pcVar4 = pcVar7;
            }
            lVar6 = (long)pcVar4 - (long)pcVar8 >> 1;
            if (0 < lVar6) {
              uVar10 = lVar6 + 1;
              do {
                *pcVar9 = *pcVar8;
                pcVar8 = pcVar8 + 1;
                pcVar9 = pcVar9 + 1;
                uVar10 = uVar10 - 1;
              } while (1 < uVar10);
            }
            pcVar8 = pcVar4 + (long)__filename;
          } while (pcVar8 < pcVar7);
        }
        resize(&local_58,(long)pcVar9 - (long)pcVar11 >> 1);
        data = &((this->d).d)->super_QArrayData;
        pcVar1 = (this->d).ptr;
        (this->d).d = local_58.d.d;
        (this->d).ptr = local_58.d.ptr;
        qVar5 = (this->d).size;
        (this->d).size = local_58.d.size;
        local_58.d.d = (Data *)data;
        local_58.d.ptr = pcVar1;
        local_58.d.size = qVar5;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
      }
      else {
        pcVar9 = pcVar1 + qVar3;
        pcVar11 = pcVar9 + (long)__filename;
        if (pcVar11 < pcVar7) {
          do {
            pcVar8 = (this->d).ptr;
            if (pcVar8 == (char16_t *)0x0) {
              pcVar8 = &_empty;
            }
            haystack_01.m_data = pcVar8;
            haystack_01.m_size = (this->d).size;
            needle_01.m_data = in_RDX;
            needle_01.m_size = (qsizetype)__filename;
            qVar5 = QtPrivate::findString
                              (haystack_01,(long)pcVar11 - (long)pcVar1 >> 1,needle_01,in_ECX);
            pcVar8 = pcVar1 + qVar5;
            if (qVar5 == -1) {
              pcVar8 = pcVar7;
            }
            __n = (long)pcVar8 - (long)pcVar11;
            if (__n != 0) {
              memmove(pcVar9,pcVar11,__n);
            }
            pcVar9 = (char16_t *)((long)pcVar9 + __n);
            pcVar11 = pcVar8 + (long)__filename;
          } while (pcVar11 < pcVar7);
          qVar5 = (this->d).size;
        }
        lVar6 = (long)pcVar9 - (long)pcVar1 >> 1;
        if (lVar6 < qVar5) {
          resize(this,lVar6);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::remove(QLatin1StringView str, Qt::CaseSensitivity cs)
{
    removeStringImpl(*this, str, cs);
    return *this;
}